

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void pybind11::raise_from(PyObject *type,char *message)

{
  long lVar1;
  PyObject *local_38;
  PyObject *tb;
  PyObject *val2;
  PyObject *val;
  PyObject *exc;
  char *message_local;
  PyObject *type_local;
  
  val = (PyObject *)0x0;
  val2 = (PyObject *)0x0;
  tb = (PyObject *)0x0;
  local_38 = (PyObject *)0x0;
  exc = (PyObject *)message;
  message_local = (char *)type;
  lVar1 = PyErr_Occurred();
  if (lVar1 == 0) {
    __assert_fail("PyErr_Occurred()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/pybind11/include/pybind11/detail/../detail/../pytypes.h"
                  ,0x323,"void pybind11::raise_from(PyObject *, const char *)");
  }
  PyErr_Fetch(&val,&val2,&local_38);
  PyErr_NormalizeException(&val,&val2,&local_38);
  if (local_38 != (PyObject *)0x0) {
    PyException_SetTraceback(val2,local_38);
    _Py_DECREF(local_38);
  }
  _Py_DECREF(val);
  lVar1 = PyErr_Occurred();
  if (lVar1 != 0) {
    __assert_fail("!PyErr_Occurred()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/pybind11/include/pybind11/detail/../detail/../pytypes.h"
                  ,0x32b,"void pybind11::raise_from(PyObject *, const char *)");
  }
  PyErr_SetString(message_local,exc);
  PyErr_Fetch(&val,&tb,&local_38);
  PyErr_NormalizeException(&val,&tb,&local_38);
  _Py_INCREF(val2);
  PyException_SetCause(tb,val2);
  PyException_SetContext(tb,val2);
  PyErr_Restore(val,tb,local_38);
  return;
}

Assistant:

inline void raise_from(PyObject *type, const char *message) {
    // Based on _PyErr_FormatVFromCause:
    // https://github.com/python/cpython/blob/467ab194fc6189d9f7310c89937c51abeac56839/Python/errors.c#L405
    // See https://github.com/pybind/pybind11/pull/2112 for details.
    PyObject *exc = nullptr, *val = nullptr, *val2 = nullptr, *tb = nullptr;

    assert(PyErr_Occurred());
    PyErr_Fetch(&exc, &val, &tb);
    PyErr_NormalizeException(&exc, &val, &tb);
    if (tb != nullptr) {
        PyException_SetTraceback(val, tb);
        Py_DECREF(tb);
    }
    Py_DECREF(exc);
    assert(!PyErr_Occurred());

    PyErr_SetString(type, message);

    PyErr_Fetch(&exc, &val2, &tb);
    PyErr_NormalizeException(&exc, &val2, &tb);
    Py_INCREF(val);
    PyException_SetCause(val2, val);
    PyException_SetContext(val2, val);
    PyErr_Restore(exc, val2, tb);
}